

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

from_chars_result
duckdb_fast_float::from_chars<double>
          (char *first,char *last,double *value,bool strict,char decimal_separator,chars_format fmt)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  from_chars_result fVar12;
  from_chars_result fVar13;
  from_chars_result fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  uint uVar18;
  byte *pbVar19;
  byte bVar20;
  byte *pbVar21;
  byte *pbVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  double dVar29;
  long lVar30;
  byte *pbVar31;
  ulong uVar32;
  long lVar33;
  byte *pbVar34;
  long lVar35;
  bool bVar36;
  bool bVar37;
  double dVar38;
  from_chars_result fVar39;
  adjusted_mantissa aVar40;
  
  if (first == last) {
    fVar39._8_8_ = 0x16;
    fVar39.ptr = first;
    return fVar39;
  }
  cVar1 = *first;
  pbVar19 = (byte *)first;
  if ((cVar1 == '-') &&
     ((pbVar19 = (byte *)(first + 1), pbVar19 == (byte *)last ||
      (*pbVar19 != decimal_separator && 9 < (byte)(*pbVar19 - 0x30))))) goto LAB_00d6e914;
  uVar32 = 0;
  pbVar22 = pbVar19;
  do {
    bVar20 = *pbVar22;
    if (9 < (byte)(bVar20 - 0x30)) {
      lVar33 = (long)pbVar22 - (long)pbVar19;
      if (bVar20 != decimal_separator) {
        pbVar34 = (byte *)0x0;
        pbVar21 = pbVar22;
        goto LAB_00d6e810;
      }
      pbVar34 = pbVar22 + 1;
      pbVar31 = pbVar22 + 9;
      pbVar21 = pbVar34;
      if ((pbVar31 <= last) &&
         (uVar27 = *(long *)pbVar34 + 0xcfcfcfcfcfcfcfd0,
         ((*(long *)pbVar34 + 0x4646464646464646U | uVar27) & 0x8080808080808080) == 0)) {
        uVar27 = (uVar27 >> 8) + uVar27 * 10;
        uVar32 = ((uVar27 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar27 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar32 * 100000000;
        pbVar21 = pbVar31;
        if ((pbVar22 + 0x11 <= last) &&
           (uVar27 = *(long *)pbVar31 + 0xcfcfcfcfcfcfcfd0,
           ((*(long *)pbVar31 + 0x4646464646464646U | uVar27) & 0x8080808080808080) == 0)) {
          uVar27 = uVar27 * 10 + (uVar27 >> 8);
          uVar32 = ((uVar27 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar27 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar32 * 100000000;
          pbVar21 = pbVar22 + 0x11;
        }
      }
      lVar35 = 0;
      goto LAB_00d6e776;
    }
    pbVar21 = pbVar22 + 1;
    if (((pbVar21 != (byte *)last) && (*pbVar21 == 0x5f)) &&
       ((strict ||
        ((pbVar21 = pbVar22 + 2, pbVar21 == (byte *)last || (9 < (byte)(*pbVar21 - 0x30)))))))
    goto LAB_00d6e914;
    uVar32 = ((ulong)bVar20 + uVar32 * 10) - 0x30;
    pbVar22 = pbVar21;
  } while (pbVar21 != (byte *)last);
  lVar33 = (long)last - (long)pbVar19;
  pbVar34 = (byte *)0x0;
  pbVar22 = (byte *)last;
LAB_00d6e810:
  if (lVar33 == 0) goto LAB_00d6e914;
  if ((((fmt & scientific) == 0) || (pbVar21 == (byte *)last)) || ((*pbVar21 | 0x20) != 0x65)) {
    if ((fmt & general) == scientific) goto LAB_00d6e914;
LAB_00d6e931:
    lVar35 = 0;
  }
  else {
    pbVar31 = pbVar21 + 1;
    if (pbVar31 == (byte *)last) {
      bVar37 = false;
    }
    else if (*pbVar31 == 0x2d) {
      pbVar31 = pbVar21 + 2;
      bVar37 = true;
    }
    else {
      if (*pbVar31 == 0x2b) {
        pbVar31 = pbVar21 + 2;
      }
      bVar37 = false;
    }
    if ((pbVar31 == (byte *)last) || (9 < (byte)(*pbVar31 - 0x30))) {
      if ((fmt & fixed) == 0) goto LAB_00d6e914;
      goto LAB_00d6e931;
    }
    lVar35 = 0;
    do {
      lVar30 = lVar35;
      if (9 < (byte)(*pbVar31 - 0x30)) break;
      lVar30 = (ulong)(byte)(*pbVar31 - 0x30) + lVar35 * 10;
      if (0xffff < lVar35) {
        lVar30 = lVar35;
      }
      pbVar21 = pbVar31 + 1;
      if (((pbVar21 != (byte *)last) && (*pbVar21 == 0x5f)) &&
         ((strict ||
          ((pbVar21 = pbVar31 + 2, pbVar21 == (byte *)last || (9 < (byte)(*pbVar21 - 0x30)))))))
      goto LAB_00d6e914;
      pbVar31 = pbVar21;
      lVar35 = lVar30;
    } while (pbVar31 != (byte *)last);
    lVar35 = -lVar30;
    if (!bVar37) {
      lVar35 = lVar30;
    }
    pbVar34 = pbVar34 + lVar35;
    pbVar21 = pbVar31;
  }
  pbVar31 = pbVar19;
  if (lVar33 < 0x14) {
    bVar37 = false;
  }
  else {
    do {
      bVar20 = *pbVar31;
      if (bVar20 != 0x30 && bVar20 != decimal_separator) break;
      lVar33 = lVar33 - (ulong)(bVar20 == 0x30);
      pbVar31 = pbVar31 + 1;
    } while (pbVar31 != (byte *)last);
    if (lVar33 < 0x14) {
      bVar37 = false;
    }
    else {
      uVar32 = 0;
      do {
        bVar20 = *pbVar19;
        if (9 < (byte)(bVar20 - 0x30)) goto LAB_00d6ea46;
        pbVar34 = pbVar19 + 1;
        if (((pbVar34 != (byte *)last) && (*pbVar34 == 0x5f)) &&
           ((strict ||
            ((pbVar34 = pbVar19 + 2, pbVar34 == (byte *)last || (9 < (byte)(*pbVar34 - 0x30)))))))
        goto LAB_00d6e914;
        pbVar19 = pbVar34;
        uVar32 = ((ulong)bVar20 + uVar32 * 10) - 0x30;
      } while ((uVar32 < 1000000000000000000) && (pbVar19 != (byte *)last));
      if (uVar32 < 1000000000000000000) {
LAB_00d6ea46:
        pbVar19 = pbVar19 + 1;
        lVar33 = 0;
        pbVar22 = pbVar19;
        pbVar34 = pbVar19;
        if (pbVar19 != (byte *)last) {
          while (pbVar22 = pbVar34, (byte)(*pbVar34 - 0x30) < 10) {
            pbVar22 = pbVar34 + 1;
            if ((pbVar22 != (byte *)last) && (*pbVar22 == 0x5f)) {
              pbVar22 = pbVar34 + 2;
              if ((pbVar22 == (byte *)last) || (9 < (byte)(*pbVar22 - 0x30))) goto LAB_00d6e914;
              lVar33 = lVar33 + 1;
            }
            uVar32 = ((ulong)*pbVar34 + uVar32 * 10) - 0x30;
            if ((999999999999999999 < uVar32) || (pbVar34 = pbVar22, pbVar22 == (byte *)last))
            break;
          }
        }
        pbVar34 = pbVar19 + lVar33 + (lVar35 - (long)pbVar22);
      }
      else {
        pbVar34 = pbVar22 + (lVar35 - (long)pbVar19);
      }
      bVar37 = true;
    }
  }
  iVar17 = (int)pbVar34;
  if (pbVar34 + -0x17 < (byte *)0xffffffffffffffd3) {
LAB_00d6eac6:
    if (uVar32 == 0) {
      uVar32 = 0;
LAB_00d6ebb4:
      uVar27 = 0;
    }
    else {
      if ((long)pbVar34 < -0x156) goto LAB_00d6ebb4;
      if ((long)pbVar34 < 0x135) goto LAB_00d6eb06;
      uVar27 = 0x7ff;
    }
    uVar23 = 0;
LAB_00d6ebba:
    if (!bVar37) goto LAB_00d6ec07;
LAB_00d6ebbf:
    uVar32 = uVar32 + 1;
    uVar18 = 0;
    if ((long)pbVar34 < -0x156) {
LAB_00d6ebeb:
      uVar28 = 0;
    }
    else {
      uVar28 = 0;
      uVar18 = 0;
      if (uVar32 != 0) {
        if (0x134 < (long)pbVar34) {
          uVar18 = 0x7ff;
          goto LAB_00d6ebeb;
        }
        uVar28 = 0x3f;
        if (uVar32 != 0) {
          for (; uVar32 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        uVar32 = uVar32 << ((byte)(uVar28 ^ 0x3f) & 0x3f);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar32;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar17 * 2 + 0x2ac) * 8);
        auVar11 = auVar4 * auVar8;
        uVar24 = auVar11._8_8_;
        if ((~auVar11._8_4_ & 0x1ff) == 0) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar32;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                   (long)(iVar17 * 2 + 0x2ad) * 8);
          uVar32 = SUB168(auVar5 * auVar9,8);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar32;
          auVar16 = auVar11 + auVar16;
          auVar11._8_8_ = uVar32;
          auVar11._0_8_ = auVar16._0_8_;
          uVar24 = auVar16._8_8_;
        }
        if ((pbVar34 + 0x1b < (byte *)0x53) || (auVar11._0_8_ != 0xffffffffffffffff)) {
          iVar17 = (((iVar17 * 0x3526a >> 0x10) - (int)(uVar28 ^ 0x3f)) -
                   (int)((long)uVar24 >> 0x3f)) + 0x43e;
          bVar20 = 9 - (char)((long)uVar24 >> 0x3f);
          uVar32 = uVar24 >> (bVar20 & 0x3f);
          if (iVar17 < 1) {
            uVar18 = 1 - iVar17;
            if (0x3f < uVar18) {
              uVar18 = 0;
              goto LAB_00d6ebeb;
            }
            uVar32 = (uVar32 >> ((byte)uVar18 & 0x3f)) +
                     (ulong)((uVar32 >> ((ulong)uVar18 & 0x3f) & 1) != 0);
            uVar28 = uVar32 >> 1;
            uVar18 = (uint)(uVar32 >> 0x35 != 0);
          }
          else {
            uVar28 = uVar32 & 0xfffffffffffffe;
            if (uVar32 << (bVar20 & 0x3f) != uVar24 || ((uint)uVar32 & 3) != 1) {
              uVar28 = uVar32;
            }
            if (1 < auVar11._0_8_) {
              uVar28 = uVar32;
            }
            if ((byte *)0x1b < pbVar34 + 4) {
              uVar28 = uVar32;
            }
            uVar32 = (ulong)((uint)uVar28 & 1);
            bVar37 = uVar32 + uVar28 >> 0x36 != 0;
            uVar28 = (uVar28 >> 1) + (uVar32 & uVar28) & 0x7fefffffffffffff;
            if (bVar37) {
              uVar28 = 0;
            }
            uVar18 = iVar17 + (uint)bVar37;
            if (0x7fe < uVar18) {
              uVar28 = 0;
              uVar18 = 0x7ff;
            }
          }
        }
        else {
          uVar28 = 0;
          uVar18 = 0xffffffff;
        }
      }
    }
    if (((uVar23 == uVar28) && (-1 < (int)(uint)uVar27)) && ((uint)uVar27 == uVar18))
    goto LAB_00d6ec07;
  }
  else {
    if (uVar32 < 0x20000000000001) {
      if (!bVar37) {
        if ((long)pbVar34 < 0) {
          dVar38 = (double)(long)uVar32 / *(double *)(powers_of_ten_double + (long)pbVar34 * -8);
        }
        else {
          dVar38 = (double)(long)uVar32 * *(double *)(powers_of_ten_double + (long)pbVar34 * 8);
        }
        fVar14._8_8_ = 0;
        fVar14.ptr = (char *)pbVar21;
        fVar13._8_8_ = 0;
        fVar13.ptr = (char *)pbVar21;
        *value = dVar38;
        if (cVar1 != '-') {
          return fVar13;
        }
        *value = -dVar38;
        return fVar14;
      }
      goto LAB_00d6eac6;
    }
LAB_00d6eb06:
    uVar27 = 0x3f;
    if (uVar32 != 0) {
      for (; uVar32 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar28 = uVar32 << ((byte)(uVar27 ^ 0x3f) & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar28;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                             (long)(iVar17 * 2 + 0x2ac) * 8);
    auVar10 = auVar2 * auVar6;
    uVar23 = auVar10._8_8_;
    if ((~auVar10._8_4_ & 0x1ff) == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar28;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar17 * 2 + 0x2ad) * 8);
      uVar23 = SUB168(auVar3 * auVar7,8);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar23;
      auVar15 = auVar10 + auVar15;
      auVar10._8_8_ = uVar23;
      auVar10._0_8_ = auVar15._0_8_;
      uVar23 = auVar15._8_8_;
    }
    if ((pbVar34 + 0x1b < (byte *)0x53) || (auVar10._0_8_ != 0xffffffffffffffff)) {
      iVar25 = (((iVar17 * 0x3526a >> 0x10) - (int)(uVar27 ^ 0x3f)) - (int)((long)uVar23 >> 0x3f)) +
               0x43e;
      bVar20 = 9 - (char)((long)uVar23 >> 0x3f);
      uVar27 = uVar23 >> (bVar20 & 0x3f);
      if (iVar25 < 1) {
        uVar18 = 1 - iVar25;
        if (0x3f < uVar18) goto LAB_00d6ebb4;
        uVar23 = (uVar27 >> ((byte)uVar18 & 0x3f)) +
                 (ulong)((uVar27 >> ((ulong)uVar18 & 0x3f) & 1) != 0);
        uVar27 = (ulong)(uVar23 >> 0x35 != 0);
        uVar23 = uVar23 >> 1;
      }
      else {
        uVar28 = uVar27 & 0xfffffffffffffe;
        if (uVar27 << (bVar20 & 0x3f) != uVar23 || ((uint)uVar27 & 3) != 1) {
          uVar28 = uVar27;
        }
        if (1 < auVar10._0_8_) {
          uVar28 = uVar27;
        }
        if ((byte *)0x1b < pbVar34 + 4) {
          uVar28 = uVar27;
        }
        uVar27 = (ulong)((uint)uVar28 & 1);
        bVar36 = uVar27 + uVar28 >> 0x36 != 0;
        uVar23 = (uVar28 >> 1) + (uVar27 & uVar28) & 0x7fefffffffffffff;
        if (bVar36) {
          uVar23 = 0;
        }
        uVar26 = iVar25 + (uint)bVar36;
        uVar18 = uVar26;
        if (0x7fe < uVar26) {
          uVar18 = 0x7ff;
        }
        uVar27 = (ulong)uVar18;
        if (0x7fe < uVar26) {
          uVar23 = 0;
        }
      }
      goto LAB_00d6ebba;
    }
    if (bVar37) {
      uVar27 = 0xffffffff;
      uVar23 = 0;
      goto LAB_00d6ebbf;
    }
  }
  aVar40 = parse_long_mantissa<duckdb_fast_float::binary_format<double>>(first,last);
  uVar23 = aVar40.mantissa;
  uVar27 = (ulong)(uint)aVar40.power2;
LAB_00d6ec07:
  dVar29 = (double)(uVar27 << 0x34 | uVar23);
  dVar38 = (double)((ulong)dVar29 | 0x8000000000000000);
  if (cVar1 != '-') {
    dVar38 = dVar29;
  }
  *value = dVar38;
  fVar12._8_8_ = 0;
  fVar12.ptr = (char *)pbVar21;
  return fVar12;
  while( true ) {
    pbVar31 = pbVar21 + 1;
    do {
      if (9 < (byte)(pbVar31[-1] - 0x30)) {
        pbVar21 = pbVar31 + -1;
        goto LAB_00d6e7ff;
      }
      uVar32 = (ulong)(byte)(pbVar31[-1] - 0x30) + uVar32 * 10;
      pbVar21 = (byte *)last;
      if (pbVar31 == (byte *)last) goto LAB_00d6e7ff;
      pbVar21 = pbVar31 + 1;
      bVar20 = *pbVar31;
      pbVar31 = pbVar21;
    } while (bVar20 != 0x5f);
    if (((strict) || (pbVar21 == (byte *)last)) ||
       (lVar35 = lVar35 + 1, 9 < (byte)(*pbVar21 - 0x30))) break;
LAB_00d6e776:
    if (pbVar21 == (byte *)last) {
LAB_00d6e7ff:
      pbVar34 = pbVar34 + (lVar35 - (long)pbVar21);
      lVar33 = lVar33 - (long)pbVar34;
      goto LAB_00d6e810;
    }
  }
LAB_00d6e914:
  fVar39 = detail::parse_infnan<double>(first,last,value);
  return fVar39;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}